

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O2

void __thiscall
PatchHandleArchipelago::handle_npc_set_uuid_on_reward
          (PatchHandleArchipelago *this,ROM *rom,RandomizerWorld *world)

{
  ROM *this_00;
  uint32_t uVar1;
  Code *code;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  allocator_type local_162;
  allocator_type local_161;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_160;
  undefined1 local_148 [24];
  undefined5 uStack_130;
  undefined3 uStack_12b;
  _Rb_tree_node_base local_128;
  size_t local_108;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_100;
  ROM *local_d0;
  DataRegister local_c8;
  Code proc;
  AddressRegister local_40;
  
  local_d0 = rom;
  uVar1 = inject_npc_addr_to_uuid_table(rom,world);
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  proc._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  proc._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  proc._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &proc._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::clrl(&proc,(Param *)local_148);
  local_148[8] = '\x01';
  local_148._0_8_ = &PTR_getXn_00246c60;
  md::Code::lea(&proc,uVar1,(AddressRegister *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"loop",(allocator<char> *)&local_160);
  md::Code::label(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_160._M_impl.super__Vector_impl_data._M_finish._0_1_ = 1;
  local_160._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  local_c8.super_Register._code = '\a';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_148._0_8_ = &PTR_getXn_00246d68;
  uStack_130 = 2;
  local_148._8_8_ = (allocator<char> *)&local_160;
  local_148._16_8_ = &local_c8;
  md::Code::cmpil(&proc,0xffffffff,(Param *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"return",(allocator<char> *)&local_160);
  md::Code::beq(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_160._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_160._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_160._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  local_c8.super_Register._code = '\a';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_148._0_8_ = &PTR_getXn_00246d68;
  uStack_130 = 2;
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_148._8_8_ = (allocator<char> *)&local_160;
  local_148._16_8_ = &local_c8;
  md::Code::cmpa(&proc,(Param *)local_148,&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"not_this_reward",(allocator<char> *)&local_160);
  md::Code::bne(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  md::Code::lsrw(&proc,'\x02',(DataRegister *)local_148);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  md::Code::addiw(&proc,0x250,(Param *)local_148);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  local_160._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  local_160._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200ff0026;
  md::Code::movew(&proc,(Param *)local_148,(Param *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"return",(allocator<char> *)&local_160);
  md::Code::bra(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"not_this_reward",(allocator<char> *)&local_160);
  md::Code::label(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  md::Code::addqb(&proc,'\x04',(Register *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"loop",(allocator<char> *)&local_160);
  md::Code::bra(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"return",(allocator<char> *)&local_160);
  md::Code::label(&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l._M_len = 1;
  __l._M_array = &local_c8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_148,__l,&local_161
            );
  local_40.super_Register._code = '\x01';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_00._M_len = 1;
  __l_00._M_array = &local_40;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_160,__l_00,
             &local_162);
  md::Code::movem_from_stack
            (&proc,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_148,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_160);
  this_00 = local_d0;
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_160);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_148);
  md::Code::rts(&proc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"",(allocator<char> *)&local_160);
  uVar1 = md::ROM::inject_code(this_00,&proc,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_128._M_left = &local_128;
  _Stack_100.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108 = 0;
  _Stack_100._0_8_ = 0;
  local_128._M_color = _S_red;
  local_128._4_4_ = 0;
  local_128._M_parent = (_Base_ptr)0x0;
  local_148._16_8_ = 0;
  _uStack_130 = 0;
  local_148._0_8_ = (_func_int **)0x0;
  local_148._8_8_ = (pointer)0x0;
  _Stack_100.super__Rb_tree_header._M_header._M_left = &_Stack_100.super__Rb_tree_header._M_header;
  _Stack_100.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_100.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_100.super__Rb_tree_header._M_node_count = 0;
  local_128._M_right = local_128._M_left;
  _Stack_100.super__Rb_tree_header._M_header._M_right =
       _Stack_100.super__Rb_tree_header._M_header._M_left;
  code = md::Code::jmp((Code *)local_148,uVar1);
  md::ROM::set_code(this_00,0x28dde,code);
  md::Code::~Code((Code *)local_148);
  md::Code::~Code(&proc);
  return;
}

Assistant:

void handle_npc_set_uuid_on_reward(md::ROM& rom, RandomizerWorld& world)
    {
        // Inject a lookup table to determine the UUID of a NPC reward based on its address
        // This is injected at "inject_code" time since it needs for RemoveStoryDependency patch to execute its
        // own inject_code routine to have the correct address for the vanilla Red Jewel item source.
        uint32_t npc_addr_to_uuid_table_addr = inject_npc_addr_to_uuid_table(rom, world);

        md::Code proc;
        {
            proc.clrl(reg_D7);
            proc.lea(npc_addr_to_uuid_table_addr, reg_A1);
            proc.label("loop");
            {
                proc.cmpil(0xFFFFFFFF, addr_(reg_A1, reg_D7));
                proc.beq("return"); // We reached the end of the table, this reward is not handled, just skip it
                proc.cmpa(addr_(reg_A1, reg_D7), reg_A0);
                proc.bne("not_this_reward");
                {
                    proc.lsrw(2, reg_D7);
                    proc.addiw(ItemSourceReward::base_reward_uuid(), reg_D7);
                    proc.movew(reg_D7, addr_(ADDR_ARCHIPELAGO_CURRENT_LOCATION_UUID));
                    proc.bra("return");
                }
                proc.label("not_this_reward");
                proc.addqb(4, reg_D7);
                proc.bra("loop");
            }
        }
        proc.label("return");
        proc.movem_from_stack({ reg_D0 }, { reg_A1 });
        proc.rts();

        uint32_t proc_addr = rom.inject_code(proc);
        rom.set_code(0x28DDE, md::Code().jmp(proc_addr));
    }